

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O2

uint8_t netaddr_get_af_maxprefix(uint32_t af_type)

{
  if (af_type == 2) {
    return ' ';
  }
  if (af_type == 0x30) {
    return '@';
  }
  if (af_type == 0x2f) {
    return '0';
  }
  if (af_type == 10) {
    return 0x80;
  }
  return '\0';
}

Assistant:

uint8_t
netaddr_get_af_maxprefix(uint32_t af_type) {
  switch (af_type) {
    case AF_INET:
      return 32;
      break;
    case AF_INET6:
      return 128;
    case AF_MAC48:
      return 48;
      break;
    case AF_EUI64:
      return 64;
      break;

    default:
      return 0;
  }
}